

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::CSVSniffer::DetectHeaderInternal_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,CSVSniffer *this,ClientContext *context,
          vector<duckdb::HeaderValue,_true> *best_header_row,CSVStateMachine *state_machine,
          SetColumns *set_columns,
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          *best_sql_types_candidates_per_column_idx,CSVReaderOptions *options,
          MultiFileOptions *file_options,CSVErrorHandler *error_handler)

{
  size_type *psVar1;
  idx_t *piVar2;
  element_type *peVar3;
  element_type *peVar4;
  StateMachine *pSVar5;
  unsigned_long uVar6;
  size_type sVar7;
  pointer pcVar8;
  string *psVar9;
  char cVar10;
  byte bVar11;
  bool bVar12;
  KeywordCategory KVar13;
  mapped_type *this_00;
  reference this_01;
  reference pvVar14;
  reference pvVar15;
  long strlen;
  utf8proc_uint8_t *puVar16;
  size_t sVar17;
  iterator iVar18;
  mapped_type *pmVar19;
  undefined8 *puVar20;
  InternalException *this_02;
  ulong uVar21;
  idx_t iVar22;
  idx_t col_number;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar23;
  pointer pHVar24;
  undefined1 *puVar25;
  char cVar26;
  CSVSniffer *__n;
  size_type sVar27;
  undefined8 uVar28;
  _Alloc_hider _Var29;
  byte bVar30;
  string *__range1;
  string *col_name;
  ulong uVar31;
  byte bVar32;
  bool bVar33;
  char *__end_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  char *__end;
  undefined1 *col_number_00;
  string_t value;
  string col_name_ascii;
  string col_name_trimmed;
  CSVError error;
  string local_198;
  ClientContext *local_178;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_170;
  CSVSniffer *local_168;
  string local_160;
  string local_140;
  string local_120;
  SetColumns *local_100;
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  LogicalType *local_e8;
  string local_e0;
  CSVError local_c0;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar24 = (pointer)set_columns[1].names;
  best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_finish = pHVar24;
  peVar3 = (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (element_type *)
           (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_178 = context;
  local_170 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  local_168 = this;
  local_100 = set_columns;
  if (peVar3 == peVar4) {
    *(undefined2 *)
     &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    pHVar24 = best_header_row[5].
              super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
              super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pHVar24 != (pointer)0x0) {
      iVar22 = 0;
      do {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"column","");
        GenerateColumnName(&local_c0.error_message,(idx_t)pHVar24,iVar22,&local_198);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_170,&local_c0.error_message);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.error_message._M_dataplus._M_p != &local_c0.error_message.field_2) {
          operator_delete(local_c0.error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        iVar22 = iVar22 + 1;
        pHVar24 = (pointer)(((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
      } while (iVar22 < pHVar24);
    }
LAB_00b9321a:
    pvVar23 = local_170;
    ReplaceNames((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_170,(CSVStateMachine *)best_header_row,
                 (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                  *)local_100,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                 (MultiFileOptions *)options,(vector<duckdb::HeaderValue,_true> *)local_178,
                 (CSVErrorHandler *)file_options);
  }
  else {
    if ((*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                   _M_max_load_factor == '\0') &&
       (pHVar24 != (pointer)(((long)peVar4 - (long)peVar3 >> 3) * -0x3333333333333333))) {
      if (*(char *)((long)&best_sql_types_candidates_per_column_idx[2]._M_h._M_rehash_policy.
                           _M_max_load_factor + 1) == '\x01') {
        *(undefined2 *)
         &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
          .super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = 0;
        pHVar24 = best_header_row[5].
                  super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pHVar24 != (pointer)0x0) {
          iVar22 = 0;
          do {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"column","");
            GenerateColumnName(&local_c0.error_message,(idx_t)pHVar24,iVar22,&local_198);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_170,&local_c0.error_message);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.error_message._M_dataplus._M_p != &local_c0.error_message.field_2) {
              operator_delete(local_c0.error_message._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            iVar22 = iVar22 + 1;
            pHVar24 = (pointer)(((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
          } while (iVar22 < pHVar24);
        }
        piVar2 = &(((CSVStateMachine *)best_header_row)->dialect_options).rows_until_header;
        *piVar2 = *piVar2 + 1;
        goto LAB_00b9321a;
      }
      CSVError::HeaderSniffingError
                (&local_c0,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                 (vector<duckdb::HeaderValue,_true> *)context,(idx_t)pHVar24,
                 (string *)
                 &best_header_row[3].
                  super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      CSVErrorHandler::Error((CSVErrorHandler *)file_options,&local_c0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.csv_row._M_dataplus._M_p != &local_c0.csv_row.field_2) {
        operator_delete(local_c0.csv_row._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_c0.full_error_message._M_dataplus._M_p._4_4_,
                      local_c0.full_error_message._M_dataplus._M_p._0_4_) !=
          &local_c0.full_error_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_c0.full_error_message._M_dataplus._M_p._4_4_,
                                 local_c0.full_error_message._M_dataplus._M_p._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.error_message._M_dataplus._M_p != &local_c0.error_message.field_2) {
        operator_delete(local_c0.error_message._M_dataplus._M_p);
      }
    }
    pSVar5 = state_machine->transition_array;
    if ((pSVar5 == (StateMachine *)0x0) ||
       (*(long *)pSVar5->state_machine[0] == *(long *)(pSVar5->state_machine[0] + 8))) {
      local_198._M_dataplus._M_p = (pointer)0x0;
      if ((element_type *)
          (local_178->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (local_178->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        bVar11 = true;
      }
      else {
        local_e8 = (LogicalType *)&((CSVStateMachine *)best_header_row)->dialect_options;
        bVar33 = true;
        bVar32 = 1;
        bVar11 = 1;
        bVar30 = 1;
        do {
          pvVar14 = vector<duckdb::HeaderValue,_true>::operator[]
                              ((vector<duckdb::HeaderValue,_true> *)local_178,
                               (size_type)local_198._M_dataplus._M_p);
          if (pvVar14->is_null == false) {
            bVar33 = false;
          }
          this_00 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_100,(key_type *)&local_198);
          this_01 = vector<duckdb::LogicalType,_true>::back(this_00);
          LogicalType::LogicalType((LogicalType *)&local_c0,VARCHAR);
          bVar12 = LogicalType::operator==(this_01,(LogicalType *)&local_c0);
          LogicalType::~LogicalType((LogicalType *)&local_c0);
          if (!bVar12) {
            pvVar14 = vector<duckdb::HeaderValue,_true>::operator[]
                                ((vector<duckdb::HeaderValue,_true> *)local_178,
                                 (size_type)local_198._M_dataplus._M_p);
            pcVar8 = (pvVar14->value)._M_dataplus._M_p;
            local_f8 = (uint)(pvVar14->value)._M_string_length;
            if (local_f8 < 0xd) {
              uStack_ec = 0;
              uStack_f4 = 0;
              uStack_f0 = 0;
              if (local_f8 != 0) {
                switchD_00b1422a::default(&uStack_f4,pcVar8,(ulong)(local_f8 & 0xf));
              }
            }
            else {
              uStack_f4 = *(undefined4 *)pcVar8;
              uStack_f0 = SUB84(pcVar8,0);
              uStack_ec = (undefined4)((ulong)pcVar8 >> 0x20);
            }
            pvVar14 = vector<duckdb::HeaderValue,_true>::operator[]
                                ((vector<duckdb::HeaderValue,_true> *)local_178,
                                 (size_type)local_198._M_dataplus._M_p);
            value.value._4_1_ = (undefined1)uStack_ec;
            value.value._5_1_ = uStack_ec._1_1_;
            value.value._6_1_ = uStack_ec._2_1_;
            value.value._7_1_ = uStack_ec._3_1_;
            value.value.pointer.length = uStack_f0;
            value.value.pointer.ptr = (char *)this_01;
            bVar12 = CanYouCastIt(local_168,(ClientContext *)CONCAT44(uStack_f4,local_f8),value,
                                  local_e8,(DialectOptions *)(ulong)pvVar14->is_null,
                                  *(bool *)best_sql_types_candidates_per_column_idx[0xc]._M_h.
                                           _M_buckets,(char)best_header_row);
            bVar32 = 0;
            bVar30 = bVar11;
            if (!bVar12) {
              bVar30 = bVar32;
              bVar11 = 0;
            }
          }
          local_198._M_dataplus._M_p = local_198._M_dataplus._M_p + 1;
        } while (local_198._M_dataplus._M_p <
                 (char *)(((long)(local_178->super_enable_shared_from_this<duckdb::ClientContext>).
                                 __weak_this_.internal.
                                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi -
                           (long)(local_178->super_enable_shared_from_this<duckdb::ClientContext>).
                                 __weak_this_.internal.
                                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr >> 3) * -0x3333333333333333));
        bVar11 = true;
        if (bVar32 == 0 && !bVar33) {
          bVar11 = bVar30 ^ 1;
        }
      }
    }
    else {
      bVar11 = DetectHeaderWithSetColumn
                         ((ClientContext *)local_168,(vector<duckdb::HeaderValue,_true> *)local_178,
                          (SetColumns *)state_machine,
                          (CSVReaderOptions *)best_sql_types_candidates_per_column_idx);
    }
    if ((char)best_sql_types_candidates_per_column_idx[1]._M_h._M_bucket_count != '\0') {
      bVar11 = *(byte *)((long)&best_sql_types_candidates_per_column_idx[1]._M_h._M_bucket_count + 1
                        );
    }
    if ((bVar11 & 1) == 0) {
      (((CSVStateMachine *)best_header_row)->dialect_options).header.set_by_user = false;
      (((CSVStateMachine *)best_header_row)->dialect_options).header.value = false;
      iVar22 = (((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
      if (iVar22 != 0) {
        col_number = 0;
        do {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"column","");
          GenerateColumnName(&local_c0.error_message,iVar22,col_number,&local_198);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_170,&local_c0.error_message);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.error_message._M_dataplus._M_p != &local_c0.error_message.field_2) {
            operator_delete(local_c0.error_message._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          col_number = col_number + 1;
          iVar22 = (((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
        } while (col_number < iVar22);
      }
    }
    else {
      (((CSVStateMachine *)best_header_row)->dialect_options).header.set_by_user = false;
      (((CSVStateMachine *)best_header_row)->dialect_options).header.value = true;
      if (((*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                      _M_max_load_factor == '\x01') &&
          ((char)best_sql_types_candidates_per_column_idx[2]._M_h._M_bucket_count == '\0')) &&
         (uVar6 = (((CSVStateMachine *)best_header_row)->dialect_options).skip_rows.value,
         uVar6 != 0)) {
        (((CSVStateMachine *)best_header_row)->dialect_options).skip_rows.set_by_user = false;
        (((CSVStateMachine *)best_header_row)->dialect_options).skip_rows.value = uVar6 - 1;
      }
      local_c0.error_message._M_dataplus._M_p = (pointer)&local_c0.full_error_message.field_2;
      local_c0.error_message._M_string_length = (size_type)&DAT_00000001;
      local_c0.error_message.field_2._M_allocated_capacity = 0;
      local_c0.error_message.field_2._8_8_ = 0;
      local_c0.full_error_message._M_dataplus._M_p._0_4_ = 0x3f800000;
      local_c0.full_error_message._M_string_length = 0;
      local_c0.full_error_message.field_2._M_allocated_capacity = 0;
      if ((element_type *)
          (local_178->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (local_178->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        col_number_00 = (undefined1 *)0x0;
      }
      else {
        __n = (CSVSniffer *)0x0;
        do {
          paVar34 = &local_160.field_2;
          local_168 = __n;
          pvVar14 = vector<duckdb::HeaderValue,_true>::operator[]
                              ((vector<duckdb::HeaderValue,_true> *)local_178,(size_type)__n);
          pvVar15 = vector<duckdb::HeaderValue,_true>::operator[]
                              ((vector<duckdb::HeaderValue,_true> *)local_178,(size_type)local_168);
          col_name = &pvVar14->value;
          sVar7 = (pvVar14->value)._M_string_length;
          bVar11 = sVar7 == 0 | pvVar15->is_null;
          if ((bVar11 == 0) &&
             (*(char *)&best_sql_types_candidates_per_column_idx[9]._M_h._M_buckets == '\0')) {
            sVar27 = 0;
            bVar11 = false;
            do {
              bVar30 = (col_name->_M_dataplus)._M_p[sVar27];
              if ((4 < bVar30 - 9) && (bVar30 != 0x20)) break;
              sVar27 = sVar27 + 1;
              bVar11 = sVar7 == sVar27;
            } while (!(bool)bVar11);
          }
          if ((bVar11 & 1) != 0) {
            iVar22 = (((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
            local_160._M_dataplus._M_p = (pointer)paVar34;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"column","");
            GenerateColumnName(&local_198,iVar22,(idx_t)local_168,&local_160);
            ::std::__cxx11::string::operator=((string *)col_name,(string *)&local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar34) {
              operator_delete(local_160._M_dataplus._M_p);
            }
          }
          if (*(char *)&best_sql_types_candidates_per_column_idx[9]._M_h._M_buckets == '\x01') {
            puVar16 = (utf8proc_uint8_t *)(pvVar14->value)._M_dataplus._M_p;
            strlen = NumericCastImpl<long,_unsigned_long,_false>::Convert
                               ((pvVar14->value)._M_string_length);
            puVar16 = utf8proc_NFKD(puVar16,strlen);
            sVar17 = ::strlen((char *)puVar16);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_198,puVar16,puVar16 + sVar17);
            free(puVar16);
            local_160._M_string_length = 0;
            local_160.field_2._M_local_buf[0] = '\0';
            local_160._M_dataplus._M_p = (pointer)paVar34;
            if (local_198._M_string_length != 0) {
              uVar31 = 0;
              do {
                bVar11 = local_198._M_dataplus._M_p[uVar31];
                if ((((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a) || (bVar11 == 0x5f)) ||
                   ((byte)(bVar11 - 0x30) < 10)) {
                  ::std::__cxx11::string::push_back((char)&local_160);
                }
                else if ((bVar11 - 9 < 5) || (bVar11 == 0x20)) {
                  ::std::__cxx11::string::append((char *)&local_160);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 < local_198._M_string_length);
            }
            TrimWhitespace(&local_140,&local_160);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            local_120._M_string_length = 0;
            local_120.field_2._M_local_buf[0] = '\0';
            if (CONCAT44(local_140._M_string_length._4_4_,(uint)local_140._M_string_length) != 0) {
              uVar31 = 0;
              bVar33 = false;
              do {
                if (local_140._M_dataplus._M_p[uVar31] == ' ') {
                  if (!bVar33) {
                    bVar33 = true;
                    ::std::__cxx11::string::append((char *)&local_120);
                  }
                }
                else {
                  ::std::__cxx11::string::push_back((char)&local_120);
                  bVar33 = false;
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 < CONCAT44(local_140._M_string_length._4_4_,
                                         (uint)local_140._M_string_length));
            }
            if (local_120._M_string_length == 0) {
              ::std::__cxx11::string::_M_replace((ulong)&local_120,0,(char *)0x0,0x13b0a08);
            }
            else {
              StringUtil::Lower(&local_e0,&local_120);
              ::std::__cxx11::string::operator=((string *)&local_120,(string *)&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
            }
            KVar13 = KeywordHelper::KeywordCategoryType(&local_120);
            if ((KVar13 < KEYWORD_COL_NAME) || ((byte)(*local_120._M_dataplus._M_p - 0x30U) < 10)) {
              ::std::operator+(&local_e0,"_",&local_120);
              ::std::__cxx11::string::operator=((string *)&local_120,(string *)&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            ::std::__cxx11::string::operator=((string *)col_name,(string *)&local_120);
            psVar9 = &local_120;
            _Var29._M_p = local_120._M_dataplus._M_p;
          }
          else {
            TrimWhitespace(&local_198,col_name);
            ::std::__cxx11::string::operator=((string *)col_name,(string *)&local_198);
            psVar9 = &local_198;
            _Var29._M_p = local_198._M_dataplus._M_p;
          }
          paVar34 = &local_160.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var29._M_p != &psVar9->field_2) goto LAB_00b93ae2;
          while (iVar18 = ::std::
                          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                  *)&local_c0,col_name),
                iVar18.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur != (__node_type *)0x0) {
            pmVar19 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_c0,col_name);
            *pmVar19 = *pmVar19 + 1;
            pcVar8 = (pvVar14->value)._M_dataplus._M_p;
            local_160._M_dataplus._M_p = (pointer)paVar34;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,pcVar8,pcVar8 + (pvVar14->value)._M_string_length);
            ::std::__cxx11::string::append((char *)&local_160);
            pmVar19 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_c0,col_name);
            uVar31 = *pmVar19;
            cVar26 = '\x01';
            if (9 < uVar31) {
              uVar21 = uVar31;
              cVar10 = '\x04';
              do {
                cVar26 = cVar10;
                if (uVar21 < 100) {
                  cVar26 = cVar26 + -2;
                  goto LAB_00b939cc;
                }
                if (uVar21 < 1000) {
                  cVar26 = cVar26 + -1;
                  goto LAB_00b939cc;
                }
                if (uVar21 < 10000) goto LAB_00b939cc;
                bVar33 = 99999 < uVar21;
                uVar21 = uVar21 / 10000;
                cVar10 = cVar26 + '\x04';
              } while (bVar33);
              cVar26 = cVar26 + '\x01';
            }
LAB_00b939cc:
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_140,cVar26);
            ::std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,uVar31);
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar34) {
              uVar31 = CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                local_160.field_2._M_local_buf[0]);
            }
            uVar21 = CONCAT44(local_140._M_string_length._4_4_,(uint)local_140._M_string_length) +
                     local_160._M_string_length;
            if (uVar31 < uVar21) {
              uVar28 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                uVar28 = local_140.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar28 < uVar21) goto LAB_00b93a3c;
              puVar20 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_140,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p
                                  );
            }
            else {
LAB_00b93a3c:
              puVar20 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            psVar1 = puVar20 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_198.field_2._M_allocated_capacity = *psVar1;
              local_198.field_2._8_8_ = puVar20[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = *psVar1;
              local_198._M_dataplus._M_p = (pointer)*puVar20;
            }
            local_198._M_string_length = puVar20[1];
            *puVar20 = psVar1;
            puVar20[1] = 0;
            *(char *)psVar1 = '\0';
            ::std::__cxx11::string::operator=((string *)col_name,(string *)&local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            _Var29._M_p = local_160._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar34) {
LAB_00b93ae2:
              operator_delete(_Var29._M_p);
            }
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_170,col_name);
          pmVar19 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_c0,col_name);
          *pmVar19 = 0;
          __n = (CSVSniffer *)&local_168->field_0x1;
          col_number_00 =
               (undefined1 *)
               (((long)(local_178->super_enable_shared_from_this<duckdb::ClientContext>).
                       __weak_this_.internal.
                       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi -
                 (long)(local_178->super_enable_shared_from_this<duckdb::ClientContext>).
                       __weak_this_.internal.
                       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr >>
                3) * -0x3333333333333333);
        } while (__n < col_number_00);
      }
      puVar25 = (undefined1 *)(((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
      if (col_number_00 < puVar25) {
        if (*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                      _M_max_load_factor == '\x01') {
          puVar25 = (undefined1 *)(((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
          if (col_number_00 < puVar25) {
            do {
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"column","");
              GenerateColumnName(&local_198,(idx_t)puVar25,(idx_t)col_number_00,&local_160);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_170,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p);
              }
              col_number_00 = col_number_00 + 1;
              puVar25 = (undefined1 *)
                        (((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
            } while (col_number_00 < puVar25);
          }
        }
        else if (col_number_00 < puVar25) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,
                     "Detected header has number of columns inferior to dialect detection","");
          InternalException::InternalException(this_02,&local_198);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local_c0);
    }
    pvVar23 = local_170;
    ReplaceNames((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_170,(CSVStateMachine *)best_header_row,
                 (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                  *)local_100,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                 (MultiFileOptions *)options,(vector<duckdb::HeaderValue,_true> *)local_178,
                 (CSVErrorHandler *)file_options);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)pvVar23;
}

Assistant:

vector<string> CSVSniffer::DetectHeaderInternal(
    ClientContext &context, vector<HeaderValue> &best_header_row, CSVStateMachine &state_machine,
    const SetColumns &set_columns, unordered_map<idx_t, vector<LogicalType>> &best_sql_types_candidates_per_column_idx,
    CSVReaderOptions &options, const MultiFileOptions &file_options, CSVErrorHandler &error_handler) {
	vector<string> detected_names;
	auto &dialect_options = state_machine.dialect_options;
	dialect_options.num_cols = best_sql_types_candidates_per_column_idx.size();
	if (best_header_row.empty()) {
		dialect_options.header = false;
		for (idx_t col = 0; col < dialect_options.num_cols; col++) {
			detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
		}
		// If the user provided names, we must replace our header with the user provided names
		ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
		             best_header_row, error_handler);
		return detected_names;
	}
	// information for header detection
	// check if header row is all null and/or consistent with detected column data types
	// If null-padding is not allowed and there is a mismatch between our header candidate and the number of columns
	// We can't detect the dialect/type options properly
	if (!options.null_padding && best_sql_types_candidates_per_column_idx.size() != best_header_row.size()) {
		if (options.ignore_errors.GetValue()) {
			dialect_options.header = false;
			for (idx_t col = 0; col < dialect_options.num_cols; col++) {
				detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
			}
			dialect_options.rows_until_header += 1;
			ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
			             best_header_row, error_handler);
			return detected_names;
		}
		auto error =
		    CSVError::HeaderSniffingError(options, best_header_row, best_sql_types_candidates_per_column_idx.size(),
		                                  state_machine.dialect_options.state_machine_options.delimiter.GetValue());
		error_handler.Error(error);
	}
	bool has_header;

	if (set_columns.IsSet()) {
		has_header = DetectHeaderWithSetColumn(context, best_header_row, set_columns, options);
	} else {
		bool first_row_consistent = true;
		bool all_varchar = true;
		bool first_row_nulls = true;
		for (idx_t col = 0; col < best_header_row.size(); col++) {
			if (!best_header_row[col].IsNull()) {
				first_row_nulls = false;
			}
			// try cast to sql_type of column
			const auto &sql_type = best_sql_types_candidates_per_column_idx[col].back();
			if (sql_type != LogicalType::VARCHAR) {
				all_varchar = false;
				if (!CanYouCastIt(context, best_header_row[col].value, sql_type, dialect_options,
				                  best_header_row[col].IsNull(), options.decimal_separator[0])) {
					first_row_consistent = false;
				}
			}
		}
		// Our header is only false if types are not all varchar, and rows are consistent
		if (all_varchar || first_row_nulls) {
			has_header = true;
		} else {
			has_header = !first_row_consistent;
		}
	}

	if (options.dialect_options.header.IsSetByUser()) {
		// Header is defined by user, use that.
		has_header = options.dialect_options.header.GetValue();
	}
	// update parser info, and read, generate & set col_names based on previous findings
	if (has_header) {
		dialect_options.header = true;
		if (options.null_padding && !options.dialect_options.skip_rows.IsSetByUser()) {
			if (dialect_options.skip_rows.GetValue() > 0) {
				dialect_options.skip_rows = dialect_options.skip_rows.GetValue() - 1;
			}
		}
		case_insensitive_map_t<idx_t> name_collision_count;

		// get header names from CSV
		for (idx_t col = 0; col < best_header_row.size(); col++) {
			string &col_name = best_header_row[col].value;

			// generate name if field is empty
			if (EmptyHeader(col_name, best_header_row[col].is_null, options.normalize_names)) {
				col_name = GenerateColumnName(dialect_options.num_cols, col);
			}

			// normalize names or at least trim whitespace
			if (options.normalize_names) {
				col_name = NormalizeColumnName(col_name);
			} else {
				col_name = TrimWhitespace(col_name);
			}

			// avoid duplicate header names
			while (name_collision_count.find(col_name) != name_collision_count.end()) {
				name_collision_count[col_name] += 1;
				col_name = col_name + "_" + to_string(name_collision_count[col_name]);
			}
			detected_names.push_back(col_name);
			name_collision_count[col_name] = 0;
		}
		if (best_header_row.size() < dialect_options.num_cols && options.null_padding) {
			for (idx_t col = best_header_row.size(); col < dialect_options.num_cols; col++) {
				detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
			}
		} else if (best_header_row.size() < dialect_options.num_cols) {
			throw InternalException("Detected header has number of columns inferior to dialect detection");
		}

	} else {
		dialect_options.header = false;
		for (idx_t col = 0; col < dialect_options.num_cols; col++) {
			detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
		}
	}

	// If the user provided names, we must replace our header with the user provided names
	ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
	             best_header_row, error_handler);
	return detected_names;
}